

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O1

bool test_DiskTableNode_behavior(void)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  initializer_list<SSTableDataEntry> __l;
  initializer_list<SSTableDataEntry> __l_00;
  initializer_list<SSTableDataEntry> __l_01;
  DiskTableNode node;
  SSTableDataEntry e;
  DiskTableNode node2;
  DiskTableNode node3;
  DiskTableNode node4;
  SSTableData data3;
  SSTableData data2;
  SSTableData data;
  SSTable t;
  DiskTableNode local_290;
  undefined1 local_278 [32];
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  DiskTableNode local_230;
  undefined1 local_218 [32];
  _List local_1f8 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  DiskTableNode local_1d8;
  DiskTableNode local_1c0;
  vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> local_1a8;
  vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> local_190;
  vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> local_178;
  SSTableDataEntry local_160;
  SSTableDataEntry local_120;
  SSTableDataEntry local_e0;
  SSTableDataEntry local_a0;
  SSTableDataEntry local_60;
  
  SSTableDataEntry::SSTableDataEntry(&local_160,false,0xbc614e,1,"Hello,World!");
  SSTableDataEntry::SSTableDataEntry(&local_120,false,0x75bc702,2,"LLLLL");
  SSTableDataEntry::SSTableDataEntry(&local_e0,true,0x4840e3f3,3,"");
  SSTableDataEntry::SSTableDataEntry(&local_a0,false,0x75998cb,4,"NIMO");
  SSTableDataEntry::SSTableDataEntry(&local_60,false,0x497ff7f0,10,"Hello,NIMO");
  __l._M_len = 5;
  __l._M_array = &local_160;
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::vector
            (&local_178,__l,(allocator_type *)local_278);
  lVar4 = -0x140;
  paVar5 = &local_60.value.field_2;
  do {
    if (paVar5 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar5->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar5->_M_allocated_capacity)[-2],paVar5->_M_allocated_capacity + 1
                     );
    }
    paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(&paVar5->_M_allocated_capacity + -8);
    lVar4 = lVar4 + 0x40;
  } while (lVar4 != 0);
  SSTableDataEntry::SSTableDataEntry(&local_160,false,0xbc614e,0,"Hello,World!");
  SSTableDataEntry::SSTableDataEntry(&local_120,false,0x75bc702,2,"LLLLL");
  SSTableDataEntry::SSTableDataEntry(&local_e0,true,0x4840e3f3,3,"");
  SSTableDataEntry::SSTableDataEntry(&local_a0,false,0x75998cb,4,"NIMO");
  SSTableDataEntry::SSTableDataEntry(&local_60,false,0x497ff7f0,0xf,"Hello,NIMO");
  __l_00._M_len = 5;
  __l_00._M_array = &local_160;
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::vector
            (&local_190,__l_00,(allocator_type *)local_278);
  lVar4 = -0x140;
  paVar5 = &local_60.value.field_2;
  do {
    if (paVar5 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar5->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar5->_M_allocated_capacity)[-2],paVar5->_M_allocated_capacity + 1
                     );
    }
    paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(&paVar5->_M_allocated_capacity + -8);
    lVar4 = lVar4 + 0x40;
  } while (lVar4 != 0);
  SSTableDataEntry::SSTableDataEntry(&local_160,false,0x75bc702,2,"LLLLL");
  SSTableDataEntry::SSTableDataEntry(&local_120,true,0x4840e3f3,3,"");
  SSTableDataEntry::SSTableDataEntry(&local_e0,false,0x75998cb,4,"NIMO");
  __l_01._M_len = 3;
  __l_01._M_array = &local_160;
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::vector
            (&local_1a8,__l_01,(allocator_type *)local_278);
  lVar4 = -0xc0;
  paVar5 = &local_e0.value.field_2;
  do {
    if (paVar5 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar5->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar5->_M_allocated_capacity)[-2],paVar5->_M_allocated_capacity + 1
                     );
    }
    paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(&paVar5->_M_allocated_capacity + -8);
    lVar4 = lVar4 + 0x40;
  } while (lVar4 != 0);
  SSTable::SSTable((SSTable *)&local_160);
  SSTable::fillData((SSTable *)&local_160,&local_178);
  std::filesystem::__cxx11::path::path<char[10],std::filesystem::__cxx11::path>
            ((path *)local_278,(char (*) [10])"testf.bin",auto_format);
  SSTable::writeToDisk((SSTable *)&local_160,(path *)local_278);
  std::filesystem::__cxx11::path::~path((path *)local_278);
  std::filesystem::__cxx11::path::path<char[10],std::filesystem::__cxx11::path>
            ((path *)local_278,(char (*) [10])"testf.bin",auto_format);
  DiskTableNode::DiskTableNode(&local_290,(path *)local_278);
  std::filesystem::__cxx11::path::~path((path *)local_278);
  bVar1 = DiskTableNode::mightIn(&local_290,0xb);
  if (!bVar1) {
    bVar1 = DiskTableNode::mightIn(&local_290,10);
    if (bVar1) {
      DiskTableNode::mightIn(&local_290,5);
      poVar3 = std::ostream::_M_insert<bool>(true);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      DiskTableNode::getEntry((SSTableDataEntry *)local_278,&local_290,6);
      bVar1 = DiskTableNode::valid(&local_290,(SSTableDataEntry *)local_278);
      if (bVar1) {
LAB_00104c20:
        bVar1 = false;
      }
      else {
        DiskTableNode::getEntry((SSTableDataEntry *)local_218,&local_290,4);
        local_278._16_8_ = local_218._16_8_;
        local_278._24_8_ = local_218._24_8_;
        local_278._0_8_ = local_218._0_8_;
        local_278._8_8_ = local_218._8_8_;
        std::__cxx11::string::operator=((string *)&local_258,(string *)local_1f8);
        if (local_1f8[0]._M_impl._M_t.
            super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            ._M_t.
            super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
            _M_head_impl !=
            (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
             )&local_1e8) {
          operator_delete((void *)local_1f8[0]._M_impl._M_t.
                                  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                  .
                                  super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                                  ._M_head_impl,local_1e8._M_allocated_capacity + 1);
        }
        if (local_278._8_8_ != 0x75998cb) goto LAB_00104c20;
        iVar2 = std::__cxx11::string::compare((char *)&local_258);
        if (iVar2 != 0) goto LAB_00104c20;
        DiskTableNode::DiskTableNode(&local_230);
        DiskTableNode::DiskTableNode(&local_1d8);
        DiskTableNode::fillData(&local_230,&local_190);
        DiskTableNode::fillData(&local_1d8,&local_1a8);
        bVar1 = DiskTableNode::intersect(&local_290,&local_230);
        if (bVar1) {
          bVar1 = DiskTableNode::intersect(&local_290,&local_1d8);
          if (!bVar1) goto LAB_00104dec;
          std::filesystem::__cxx11::path::path<char[11],std::filesystem::__cxx11::path>
                    ((path *)local_218,(char (*) [11])"testf2.bin",auto_format);
          DiskTableNode::writeToDisk(&local_230,(path *)local_218);
          std::filesystem::__cxx11::path::~path((path *)local_218);
          std::filesystem::__cxx11::path::path<char[11],std::filesystem::__cxx11::path>
                    ((path *)local_218,(char (*) [11])"testf2.bin",auto_format);
          DiskTableNode::DiskTableNode(&local_1c0,(path *)local_218);
          std::filesystem::__cxx11::path::~path((path *)local_218);
          DiskTableNode::getEntry((SSTableDataEntry *)local_218,&local_1c0,4);
          iVar2 = std::__cxx11::string::compare((char *)local_1f8);
          bVar1 = iVar2 == 0;
          if (local_1f8[0]._M_impl._M_t.
              super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
              ._M_t.
              super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
              .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
              _M_head_impl !=
              (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
               )&local_1e8) {
            operator_delete((void *)local_1f8[0]._M_impl._M_t.
                                    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                    .
                                    super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                                    ._M_head_impl,local_1e8._M_allocated_capacity + 1);
          }
          if (iVar2 == 0) {
            remove("testf.bin");
            remove("testf2.bin");
          }
          DiskTableNode::~DiskTableNode(&local_1c0);
        }
        else {
LAB_00104dec:
          bVar1 = false;
        }
        DiskTableNode::~DiskTableNode(&local_1d8);
        DiskTableNode::~DiskTableNode(&local_230);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_head_impl != &local_248) {
        operator_delete(local_258._M_head_impl,local_248._M_allocated_capacity + 1);
      }
      goto LAB_00104c41;
    }
  }
  bVar1 = false;
LAB_00104c41:
  DiskTableNode::~DiskTableNode(&local_290);
  SSTable::~SSTable((SSTable *)&local_160);
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::~vector(&local_1a8);
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::~vector(&local_190);
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::~vector(&local_178);
  return bVar1;
}

Assistant:

bool test_DiskTableNode_behavior() {
    auto data = SSTableData{
            {false, 12345678,   1,  "Hello,World!"},
            {false, 123455234,  2,  "LLLLL"},
            {true,  1212212211, 3,  ""},
            {false, 123312331,  4,  "NIMO"},
            {false, 1233123312, 10, "Hello,NIMO"}
    };
    auto data2 = SSTableData{
            {false, 12345678,   0,  "Hello,World!"},
            {false, 123455234,  2,  "LLLLL"},
            {true,  1212212211, 3,  ""},
            {false, 123312331,  4,  "NIMO"},
            {false, 1233123312, 15, "Hello,NIMO"}
    };
    auto data3 = SSTableData{
            {false, 123455234,  2, "LLLLL"},
            {true,  1212212211, 3, ""},
            {false, 123312331,  4, "NIMO"},
    };
    auto t = SSTable{};
    t.fillData(std::move(data));
    t.writeToDisk("testf.bin");

    auto node = DiskTableNode{path{"testf.bin"}};

    if (node.mightIn(11)) {
        return false;
    }

    if (!node.mightIn(10)) {
        return false;
    }
    std::cout << node.mightIn(5) << std::endl;

    auto e = node.getEntry(6);

    if (node.valid(e)) {
        return false;
    }

    e = node.getEntry(4);

    if (e.timestamp != 123312331 || e.value != "NIMO") {
        return false;
    }

    auto node2 = DiskTableNode{};
    auto node3 = DiskTableNode{};
    node2.fillData(std::move(data2));
    node3.fillData(std::move(data3));

    if (!node.intersect(node2) || !node.intersect(node3)) {
        return false;
    }

    node2.writeToDisk("testf2.bin");

    auto node4 = DiskTableNode{path{"testf2.bin"}};

    if (node4.getEntry(4).value != "NIMO") {
        return false;
    }

    remove("testf.bin");
    remove("testf2.bin");
    return true;
}